

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O0

size_t __thiscall
asmjit::v1_14::Support::BitVectorOpIterator<unsigned_long,_asmjit::v1_14::Support::AndNot>::next
          (BitVectorOpIterator<unsigned_long,_asmjit::v1_14::Support::AndNot> *this)

{
  long lVar1;
  long lVar2;
  ulong *puVar3;
  uint uVar4;
  ulong uVar5;
  long *in_RDI;
  bool bVar6;
  size_t n;
  uint32_t bit;
  unsigned_long bitWord;
  char *in_stack_00000390;
  int in_stack_0000039c;
  char *in_stack_000003a0;
  ulong local_40;
  
  local_40 = in_RDI[4];
  if (local_40 == 0) {
    DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
  }
  uVar4 = 0;
  for (uVar5 = local_40; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
    uVar4 = uVar4 + 1;
  }
  local_40 = local_40 - 1 & local_40;
  lVar1 = in_RDI[2];
  while( true ) {
    bVar6 = false;
    if (local_40 == 0) {
      lVar2 = in_RDI[2];
      in_RDI[2] = lVar2 + 0x40U;
      bVar6 = lVar2 + 0x40U < (ulong)in_RDI[3];
    }
    if (!bVar6) break;
    puVar3 = (ulong *)*in_RDI;
    *in_RDI = (long)(puVar3 + 1);
    local_40 = *puVar3;
    puVar3 = (ulong *)in_RDI[1];
    in_RDI[1] = (long)(puVar3 + 1);
    local_40 = local_40 & (*puVar3 ^ 0xffffffffffffffff);
  }
  in_RDI[4] = local_40;
  return lVar1 + (ulong)uVar4;
}

Assistant:

ASMJIT_FORCE_INLINE size_t next() noexcept {
    T bitWord = _current;
    ASMJIT_ASSERT(bitWord != T(0));

    uint32_t bit = ctz(bitWord);
    bitWord &= T(bitWord - 1u);

    size_t n = _idx + bit;
    while (!bitWord && (_idx += kTSizeInBits) < _end)
      bitWord = OperatorT::op(*_aPtr++, *_bPtr++);

    _current = bitWord;
    return n;
  }